

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

char * find_host_sep(char *url)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar1 = strstr(url,"//");
  pcVar2 = pcVar1 + 2;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = url;
  }
  pcVar1 = strchr(pcVar2,0x3f);
  pcVar2 = strchr(pcVar2,0x2f);
  if (pcVar2 == (char *)0x0) {
    sVar3 = strlen(url);
    pcVar2 = url + sVar3;
  }
  if (pcVar1 == (char *)0x0) {
    sVar3 = strlen(url);
    pcVar1 = url + sVar3;
  }
  if (pcVar2 < pcVar1) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

static const char *find_host_sep(const char *url)
{
  const char *sep;
  const char *query;

  /* Find the start of the hostname */
  sep = strstr(url, "//");
  if(!sep)
    sep = url;
  else
    sep += 2;

  query = strchr(sep, '?');
  sep = strchr(sep, '/');

  if(!sep)
    sep = url + strlen(url);

  if(!query)
    query = url + strlen(url);

  return sep < query ? sep : query;
}